

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare::operator()
          (FileCompare *this,string_view a,FileEntry *b)

{
  bool bVar1;
  string_view __y;
  FileEntry *b_local;
  FileCompare *this_local;
  string_view a_local;
  
  __y = FileEntry::name(b,this->index);
  bVar1 = std::operator<(a,__y);
  return bVar1;
}

Assistant:

bool operator()(absl::string_view a, const FileEntry& b) const {
      return a < b.name(index);
    }